

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase172::run(TestCase172 *this)

{
  SourceLocation location;
  bool bVar1;
  __pid_t _Var2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SourceLocation local_1a0;
  StringPtr local_188;
  bool local_172;
  undefined1 auStack_170 [6];
  bool _kj_shouldLog;
  StringPtr local_158;
  char (*local_148) [4];
  undefined1 local_140 [8];
  DebugComparison<const_char_(&)[4],_kj::StringPtr> _kjCondition;
  SourceLocation local_108;
  Promise<kj::StringPtr> *local_f0;
  undefined1 local_e1 [17];
  Promise<int> local_d0;
  Promise<kj::StringPtr> promise2;
  int line;
  Promise<int> promise;
  undefined1 local_a8 [8];
  WaitScope waitScope;
  EventLoop loop;
  TestCase172 *this_local;
  
  EventLoop::EventLoop((EventLoop *)&waitScope.runningStacksPool);
  WaitScope::WaitScope((WaitScope *)local_a8,(EventLoop *)&waitScope.runningStacksPool);
  evalLater<kj::(anonymous_namespace)::TestCase172::run()::__0>
            ((kj *)&line,(Type *)((long)&promise2.super_PromiseBase.node.ptr + 7));
  promise2.super_PromiseBase.node.ptr._0_4_ = 0xb1;
  Promise<int>::then<kj::(anonymous_namespace)::TestCase172::run()::__1>(&local_d0,(Type *)&line);
  local_f0 = &promise2;
  SourceLocation::SourceLocation
            (&local_108,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0xb6,0xe);
  location.function = local_108.function;
  location.fileName = local_108.fileName;
  location.lineNumber = local_108.lineNumber;
  location.columnNumber = local_108.columnNumber;
  Promise<kj::StringPtr>::
  then<kj::(anonymous_namespace)::TestCase172::run()::__2,kj::(anonymous_namespace)::TestCase172::run()::__3>
            ((Promise<kj::StringPtr> *)(local_e1 + 1),(Type *)&local_d0,(Type *)local_e1,location);
  Promise<kj::StringPtr>::operator=
            ((Promise<kj::StringPtr> *)&local_d0,(Promise<kj::StringPtr> *)(local_e1 + 1));
  Promise<kj::StringPtr>::~Promise((Promise<kj::StringPtr> *)(local_e1 + 1));
  local_148 = (char (*) [4])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])0x91ea93);
  SourceLocation::SourceLocation
            ((SourceLocation *)auStack_170,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0xba,0x2c);
  _Var2 = Promise<kj::StringPtr>::wait((Promise<kj::StringPtr> *)&local_d0,local_a8);
  local_158.content.ptr = (char *)CONCAT44(extraout_var,_Var2);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_kj::StringPtr> *)local_140,
             (DebugExpression<char_const(&)[4]> *)&local_148,&local_158);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_140);
  if (!bVar1) {
    local_172 = kj::_::Debug::shouldLog(ERROR);
    while (local_172 != false) {
      SourceLocation::SourceLocation
                (&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,"run",0xba,0x2c);
      _Var2 = Promise<kj::StringPtr>::wait((Promise<kj::StringPtr> *)&local_d0,local_a8);
      local_188.content.ptr = (char *)CONCAT44(extraout_var_00,_Var2);
      kj::_::Debug::
      log<char_const(&)[55],kj::_::DebugComparison<char_const(&)[4],kj::StringPtr>&,char_const(&)[4],kj::StringPtr>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0xba,ERROR,
                 "\"failed: expected \" \"(\\\"baz\\\") == (promise2.wait(waitScope))\", _kjCondition, \"baz\", promise2.wait(waitScope)"
                 ,(char (*) [55])"failed: expected (\"baz\") == (promise2.wait(waitScope))",
                 (DebugComparison<const_char_(&)[4],_kj::StringPtr> *)local_140,
                 (char (*) [4])0x91ea93,&local_188);
      local_172 = false;
    }
  }
  Promise<kj::StringPtr>::~Promise((Promise<kj::StringPtr> *)&local_d0);
  Promise<int>::~Promise((Promise<int> *)&line);
  WaitScope::~WaitScope((WaitScope *)local_a8);
  EventLoop::~EventLoop((EventLoop *)&waitScope.runningStacksPool);
  return;
}

Assistant:

TEST(Async, PropagateExceptionTypeChange) {
  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<int> promise = evalLater(
      [&]() -> int { KJ_FAIL_ASSERT("foo") { return 123; } });
  int line = __LINE__ - 1;

  Promise<StringPtr> promise2 = promise.then([](int i) -> StringPtr { return "foo"; });

  promise2 = promise2.then(
      [](StringPtr s) -> StringPtr { return "bar"; },
      [&](Exception&& e) -> StringPtr { EXPECT_EQ(line, e.getLine()); return "baz"; });

  EXPECT_EQ("baz", promise2.wait(waitScope));
}